

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O2

void Inta_ManPrintResolvent(Vec_Int_t *vResLits)

{
  uint uVar1;
  int i;
  
  printf("Resolvent: {");
  for (i = 0; i < vResLits->nSize; i = i + 1) {
    uVar1 = Vec_IntEntry(vResLits,i);
    printf(" %d",(ulong)uVar1);
  }
  puts(" }");
  return;
}

Assistant:

void Inta_ManPrintResolvent( Vec_Int_t * vResLits )
{
    int i, Entry;
    printf( "Resolvent: {" );
    Vec_IntForEachEntry( vResLits, Entry, i )
        printf( " %d", Entry );
    printf( " }\n" );
}